

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void invalidateIncrblobCursors(Btree *pBtree,Pgno pgnoRoot,i64 iRow,int isClearTable)

{
  BtCursor *pBVar1;
  
  if (pBtree->hasIncrblobCur != '\0') {
    pBtree->hasIncrblobCur = '\0';
    pBVar1 = (BtCursor *)pBtree->pBt;
    while (pBVar1 = pBVar1->pNext, pBVar1 != (BtCursor *)0x0) {
      if ((((pBVar1->curFlags & 0x10) != 0) &&
          (pBtree->hasIncrblobCur = '\x01', pBVar1->pgnoRoot == pgnoRoot)) &&
         ((isClearTable != 0 || ((pBVar1->info).nKey == iRow)))) {
        pBVar1->eState = '\0';
      }
    }
  }
  return;
}

Assistant:

static void invalidateIncrblobCursors(
  Btree *pBtree,          /* The database file to check */
  Pgno pgnoRoot,          /* The table that might be changing */
  i64 iRow,               /* The rowid that might be changing */
  int isClearTable        /* True if all rows are being deleted */
){
  BtCursor *p;
  if( pBtree->hasIncrblobCur==0 ) return;
  assert( sqlite3BtreeHoldsMutex(pBtree) );
  pBtree->hasIncrblobCur = 0;
  for(p=pBtree->pBt->pCursor; p; p=p->pNext){
    if( (p->curFlags & BTCF_Incrblob)!=0 ){
      pBtree->hasIncrblobCur = 1;
      if( p->pgnoRoot==pgnoRoot && (isClearTable || p->info.nKey==iRow) ){
        p->eState = CURSOR_INVALID;
      }
    }
  }
}